

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

Error asmjit::v1_14::Formatter::formatFuncArgs
                (String *sb,FormatFlags formatFlags,BaseCompiler *cc,FuncDetail *fd,
                ArgPack *argPacks)

{
  ModifyOp op;
  Error EVar1;
  long in_RCX;
  size_t in_RDX;
  FuncDetail *in_RDI;
  String *in_R8;
  Error _err_1;
  Error _err;
  uint32_t argIndex;
  uint32_t argCount;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  ModifyOp local_70;
  Error local_3c;
  char *in_stack_ffffffffffffffd0;
  FuncDetail *in_stack_ffffffffffffffd8;
  BaseCompiler *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  String *in_stack_fffffffffffffff0;
  
  op = (ModifyOp)*(byte *)(in_RCX + 0x74);
  if (op == kAssign) {
    local_3c = String::_opString(in_R8,kAssign,
                                 (char *)CONCAT44(in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88),
                                 in_stack_ffffffffffffff80);
  }
  else {
    for (local_70 = kAssign; local_70 < op; local_70 = local_70 + kAppend) {
      if (local_70 != kAssign) {
        in_stack_ffffffffffffffd0 = ", ";
        in_stack_ffffffffffffffd8 = in_RDI;
        EVar1 = String::_opString(in_R8,op,(char *)CONCAT44(in_stack_ffffffffffffff8c,
                                                            in_stack_ffffffffffffff88),
                                  in_stack_ffffffffffffff80);
        if (EVar1 != 0) {
          return EVar1;
        }
        in_stack_ffffffffffffff8c = 0;
      }
      in_stack_ffffffffffffff80 = in_RDX;
      FuncDetail::argPack(in_RDI,in_stack_ffffffffffffff68);
      EVar1 = formatFuncValuePack(in_stack_fffffffffffffff0,
                                  (FormatFlags)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                                  in_stack_ffffffffffffffe0,
                                  (FuncValuePack *)in_stack_ffffffffffffffd8,
                                  (RegOnly *)in_stack_ffffffffffffffd0);
      if (EVar1 != 0) {
        return EVar1;
      }
      in_stack_ffffffffffffff88 = 0;
    }
    local_3c = 0;
  }
  return local_3c;
}

Assistant:

static Error formatFuncArgs(
  String& sb,
  FormatFlags formatFlags,
  const BaseCompiler* cc,
  const FuncDetail& fd,
  const FuncNode::ArgPack* argPacks) noexcept {

  uint32_t argCount = fd.argCount();
  if (!argCount)
    return sb.append("void");

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    if (argIndex)
      ASMJIT_PROPAGATE(sb.append(", "));

    ASMJIT_PROPAGATE(formatFuncValuePack(sb, formatFlags, cc, fd.argPack(argIndex), argPacks[argIndex]._data));
  }

  return kErrorOk;
}